

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.cpp
# Opt level: O1

void * QArrayData::allocate1(QArrayData **dptr,qsizetype capacity,AllocationOption option)

{
  QArrayData *pQVar1;
  size_t __size;
  void *pvVar2;
  CalculateGrowingBlockSizeResult CVar3;
  
  if (capacity != 0) {
    if (option == Grow) {
      CVar3 = qCalculateGrowingBlockSize(capacity,1,0x12);
      capacity = CVar3.elementCount;
      __size = CVar3.size;
    }
    else {
      __size = 0xffffffffffffffff;
      if (((ulong)capacity < 0xffffffffffffffee) && (-1 < (long)(capacity + 0x12U))) {
        __size = capacity + 0x12U;
      }
    }
    if (-1 < (long)__size) {
      pQVar1 = (QArrayData *)malloc(__size);
      if (pQVar1 == (QArrayData *)0x0) {
        pvVar2 = (void *)0x0;
      }
      else {
        (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i = 1;
        (pQVar1->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
        super_QFlagsStorage<QArrayData::ArrayOption>.i = 0;
        pvVar2 = (void *)((ulong)((long)&pQVar1[1].alloc + 7U) & 0xfffffffffffffff0);
        pQVar1->alloc = capacity;
      }
      goto LAB_001059d1;
    }
  }
  pvVar2 = (void *)0x0;
  pQVar1 = (QArrayData *)0x0;
LAB_001059d1:
  *dptr = pQVar1;
  return pvVar2;
}

Assistant:

void *QArrayData::allocate1(QArrayData **dptr, qsizetype capacity, AllocationOption option) noexcept
{
    Q_ASSERT(dptr);

    auto r = allocateHelper(1, alignof(AlignedQArrayData), capacity, option);
    *dptr = r.header;
    return r.data;
}